

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_uescape(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  void *pvVar6;
  undefined1 *__n;
  undefined1 *puVar7;
  undefined8 uVar8;
  void *__buf;
  undefined1 *puVar9;
  undefined8 extraout_RAX;
  char *pcVar10;
  void *__s2;
  undefined1 *puVar11;
  char *pcVar12;
  undefined8 extraout_RAX_00;
  int *__haystack;
  undefined8 extraout_RAX_01;
  long *plVar13;
  undefined8 extraout_RAX_02;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  undefined **ppuVar20;
  undefined **ppuVar21;
  void *pvVar22;
  int *piVar23;
  undefined **ppuVar24;
  int *piVar25;
  double dVar26;
  int extraout_XMM0_Db;
  uencode_test_t tests [7];
  bson_t b;
  bson_error_t error;
  code **ppcVar27;
  undefined4 uStack_355c;
  undefined8 uStack_3558;
  undefined2 uStack_3550;
  int iStack_3548;
  int iStack_3544;
  char acStack_3540 [504];
  code *pcStack_3348;
  undefined1 auStack_3338 [512];
  char *pcStack_3138;
  code *pcStack_3130;
  int iStack_3120;
  int iStack_311c;
  char acStack_3118 [504];
  long *plStack_2f20;
  char *pcStack_2f18;
  char *pcStack_2f10;
  undefined **ppuStack_2f08;
  long lStack_2e90;
  long lStack_2e88;
  undefined1 auStack_2e80 [128];
  undefined1 auStack_2e00 [232];
  undefined1 auStack_2d18 [608];
  long *plStack_2ab8;
  code *pcStack_2ab0;
  undefined1 auStack_2aa8 [8];
  char acStack_2aa0 [16];
  char *pcStack_2a90;
  code *pcStack_2a88;
  uint uStack_2a04;
  undefined8 uStack_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 uStack_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined1 auStack_2938 [648];
  int *piStack_26b0;
  char *pcStack_26a8;
  undefined **ppuStack_26a0;
  undefined1 *puStack_2698;
  undefined **ppuStack_2690;
  code *pcStack_2688;
  undefined1 auStack_2680 [240];
  undefined1 auStack_2590 [648];
  code *apcStack_2308 [16];
  undefined *puStack_2288;
  undefined1 auStack_2280 [200];
  undefined8 uStack_21b8;
  int aiStack_21b0 [160];
  int *piStack_1f30;
  double *pdStack_1f28;
  undefined **ppuStack_1f20;
  int *piStack_1f18;
  int *piStack_1f10;
  code *apcStack_1f08 [16];
  double dStack_1e88;
  int aiStack_1e80 [50];
  int iStack_1db8;
  int iStack_1db4;
  int aiStack_1db0 [160];
  undefined8 uStack_1b30;
  undefined1 *puStack_1b28;
  char *pcStack_1b20;
  char *pcStack_1b18;
  undefined **ppuStack_1b10;
  code *pcStack_1b08;
  int iStack_1b00;
  int iStack_1afc;
  char acStack_1af8 [504];
  undefined1 auStack_1900 [336];
  char *pcStack_17b0;
  undefined1 *puStack_17a8;
  undefined1 *puStack_17a0;
  void *pvStack_1798;
  void *pvStack_1790;
  code *pcStack_1788;
  undefined1 auStack_1780 [128];
  char acStack_1700 [232];
  undefined1 auStack_1618 [648];
  char *pcStack_1390;
  code *pcStack_1388;
  undefined1 auStack_1380 [128];
  char acStack_1300 [224];
  int iStack_1220;
  int iStack_121c;
  char acStack_1218 [640];
  char *pcStack_f98;
  void *pvStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [128];
  char acStack_f00 [232];
  undefined1 auStack_e18 [648];
  char *pcStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [232];
  int iStack_a98;
  int iStack_a94;
  char acStack_a90 [640];
  char *pcStack_810;
  code *apcStack_808 [16];
  uint uStack_784;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_6b8 [648];
  undefined1 *puStack_430;
  undefined1 *puStack_428;
  undefined1 *puStack_420;
  void *pvStack_418;
  void *pvStack_410;
  code *pcStack_408;
  uint local_3fc;
  void *local_3f8;
  char *local_3f0;
  void *local_3e8;
  char *local_3e0;
  void *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined8 local_398;
  char *local_390;
  undefined8 local_388;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  pcStack_408 = (code *)0x132967;
  uVar5 = bson_bcon_magic();
  pcStack_408 = (code *)0x132989;
  local_3f8 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_48e4 + 0xc,0);
  pcStack_408 = (code *)0x1329ad;
  pvVar6 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  pcStack_408 = (code *)0x1329cf;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  pcStack_408 = (code *)0x1329f1;
  puVar7 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  pcStack_408 = (code *)0x132a0f;
  uVar8 = bcon_new(0,"",uVar5,0,"",0);
  pcStack_408 = (code *)0x132a31;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  pcStack_408 = (code *)0x132a39;
  local_388 = bson_new();
  local_3f0 = "{ \"euro\": \"\\u20AC\"}";
  local_3e8 = local_3f8;
  local_3e0 = "{ \"crlf\": \"\\r\\n\"}";
  local_3d0 = "{ \"quote\": \"\\\"\"}";
  local_3c0 = "{ \"backslash\": \"\\\\\"}";
  local_3b0 = "{ \"\": \"\"}";
  local_3a0 = "{ \"escapes\": \"\\f\\b\\t\"}";
  local_390 = "{ \"nil\": \"\\u0000\"}";
  pcStack_408 = (code *)0x132ad6;
  local_3d8 = pvVar6;
  local_3c8 = __n;
  local_3b8 = puVar7;
  local_3a8 = uVar8;
  local_398 = uVar5;
  bson_append_utf8(local_388,"nil",0xffffffff,"",1);
  pvVar22 = (void *)0x8;
  while( true ) {
    pcStack_408 = (code *)0x132b00;
    cVar1 = bson_init_from_json(local_380,*(undefined8 *)((long)&local_3f8 + (long)pvVar22),
                                0xffffffffffffffff,local_2b8);
    puVar11 = local_380;
    __buf = pvVar22;
    if (cVar1 == '\0') break;
    pcStack_408 = (code *)0x132b13;
    local_3f8 = (void *)bson_get_data(local_380);
    puVar11 = *(undefined1 **)((long)&local_3f0 + (long)pvVar22);
    pcStack_408 = (code *)0x132b25;
    __buf = (void *)bson_get_data(puVar11);
    if (*(uint *)(puVar11 + 4) != local_37c) {
LAB_00132b9a:
      puVar7 = local_380;
      pcStack_408 = (code *)0x132bac;
      __n = (undefined1 *)bson_as_canonical_extended_json(puVar7);
      pcStack_408 = (code *)0x132bb9;
      uVar5 = bson_as_canonical_extended_json(puVar11);
      pvVar6 = local_3f8;
      uVar3 = *(uint *)(puVar11 + 4);
      if (local_37c == 0) goto LAB_00132be8;
      uVar17 = 0;
      goto LAB_00132bcf;
    }
    pcStack_408 = (code *)0x132b3c;
    puVar7 = (undefined1 *)bson_get_data(puVar11);
    pcStack_408 = (code *)0x132b47;
    pvVar6 = (void *)bson_get_data(local_380);
    pcStack_408 = (code *)0x132b55;
    iVar2 = bcmp(puVar7,pvVar6,(ulong)*(uint *)(puVar11 + 4));
    if (iVar2 != 0) goto LAB_00132b9a;
    pcStack_408 = (code *)0x132b64;
    bson_destroy(local_380);
    pvVar22 = (void *)((long)pvVar22 + 0x10);
    __n = local_380;
    pvVar6 = __buf;
    if (pvVar22 == (void *)0x78) {
      lVar16 = 8;
      do {
        pcStack_408 = (code *)0x132b81;
        bson_destroy(*(undefined8 *)((long)&local_3f0 + lVar16));
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x78);
      return;
    }
  }
  goto LAB_00132cac;
  while( true ) {
    if (*(char *)((long)local_3f8 + uVar17) != *(char *)((long)__buf + uVar17)) goto LAB_00132c91;
    uVar17 = uVar17 + 1;
    if (local_37c == (uint)uVar17) break;
LAB_00132bcf:
    if (uVar3 == (uint)uVar17) break;
  }
LAB_00132be8:
  uVar4 = local_37c;
  if (local_37c < uVar3) {
    uVar4 = uVar3;
  }
  uVar17 = (ulong)(uVar4 - 1);
  while( true ) {
    pcStack_408 = (code *)0x132c0d;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17,__n,uVar5);
    pcStack_408 = (code *)0x132c25;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    pcStack_408 = (code *)0x132c40;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    local_3fc = uVar3;
    if (uVar3 == 0xffffffff) break;
    puVar7 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132c9d;
    __n = (undefined1 *)(ulong)local_37c;
    pcStack_408 = (code *)0x132c6a;
    puVar9 = (undefined1 *)write(uVar3,pvVar6,(size_t)__n);
    if (puVar9 != __n) goto LAB_00132ca2;
    puVar11 = (undefined1 *)(ulong)*(uint *)(puVar11 + 4);
    pcStack_408 = (code *)0x132c80;
    puVar9 = (undefined1 *)write(uVar4,__buf,(size_t)puVar11);
    if (puVar9 != puVar11) goto LAB_00132ca7;
    uVar17 = (ulong)uVar4;
    pcStack_408 = (code *)0x132c91;
    test_bson_json_uescape_cold_4();
    uVar5 = extraout_RAX;
LAB_00132c91:
    uVar17 = uVar17 & 0xffffffff;
  }
  pcStack_408 = (code *)0x132c9d;
  test_bson_json_uescape_cold_6();
LAB_00132c9d:
  pcStack_408 = (code *)0x132ca2;
  test_bson_json_uescape_cold_5();
LAB_00132ca2:
  pcStack_408 = (code *)0x132ca7;
  test_bson_json_uescape_cold_2();
LAB_00132ca7:
  pcStack_408 = (code *)0x132cac;
  test_bson_json_uescape_cold_3();
LAB_00132cac:
  pcStack_408 = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_808[0] = (code *)0x132cd6;
  puStack_430 = puVar11;
  puStack_428 = __n;
  puStack_420 = puVar7;
  pvStack_418 = __buf;
  pvStack_410 = pvVar6;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  uVar5 = bson_bcon_magic();
  apcStack_808[0] = (code *)0x132cf5;
  pcVar10 = (char *)bcon_new(0,anon_var_dwarf_48e4 + 0xc,uVar5,0,"euro",0);
  apcStack_808[0] = (code *)0x132d1b;
  cVar1 = bson_init_from_json(auStack_780,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,auStack_6b8)
  ;
  if (cVar1 == '\0') {
    apcStack_808[0] = (code *)0x132e94;
    test_bson_json_uescape_key_cold_1();
  }
  else {
    apcStack_808[0] = (code *)0x132d33;
    pvVar6 = (void *)bson_get_data(auStack_780);
    apcStack_808[0] = (code *)0x132d3e;
    __buf = (void *)bson_get_data(pcVar10);
    if (*(uint *)(pcVar10 + 4) == uStack_77c) {
      apcStack_808[0] = (code *)0x132d53;
      pvVar22 = (void *)bson_get_data(pcVar10);
      apcStack_808[0] = (code *)0x132d63;
      __s2 = (void *)bson_get_data(auStack_780);
      apcStack_808[0] = (code *)0x132d71;
      iVar2 = bcmp(pvVar22,__s2,(ulong)*(uint *)(pcVar10 + 4));
      if (iVar2 == 0) {
        apcStack_808[0] = (code *)0x132d82;
        bson_destroy(auStack_780);
        apcStack_808[0] = (code *)0x132d8a;
        bson_destroy(pcVar10);
        return;
      }
    }
    puVar7 = auStack_780;
    apcStack_808[0] = (code *)0x132dab;
    __n = (undefined1 *)bson_as_canonical_extended_json(puVar7);
    apcStack_808[0] = (code *)0x132db8;
    uVar5 = bson_as_canonical_extended_json(pcVar10);
    uVar3 = *(uint *)(pcVar10 + 4);
    if (uStack_77c != 0) {
      uVar17 = 0;
      do {
        if (uVar3 == (uint)uVar17) break;
        if (*(char *)((long)pvVar6 + uVar17) != *(char *)((long)__buf + uVar17)) goto LAB_00132e88;
        uVar17 = uVar17 + 1;
      } while (uStack_77c != (uint)uVar17);
    }
    uVar4 = uStack_77c;
    if (uStack_77c < uVar3) {
      uVar4 = uVar3;
    }
    uVar17 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_808[0] = (code *)0x132e04;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17,__n,uVar5);
      apcStack_808[0] = (code *)0x132e1c;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      __n = (undefined1 *)(ulong)uVar3;
      apcStack_808[0] = (code *)0x132e37;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_784 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar7 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_00132e99;
      __n = (undefined1 *)(ulong)uStack_77c;
      apcStack_808[0] = (code *)0x132e61;
      puVar11 = (undefined1 *)write(uVar3,pvVar6,(size_t)__n);
      if (puVar11 != __n) goto LAB_00132e9e;
      pcVar10 = (char *)(ulong)*(uint *)(pcVar10 + 4);
      apcStack_808[0] = (code *)0x132e77;
      pcVar12 = (char *)write(uVar4,__buf,(size_t)pcVar10);
      if (pcVar12 != pcVar10) goto LAB_00132ea3;
      uVar17 = (ulong)uVar4;
      apcStack_808[0] = (code *)0x132e88;
      test_bson_json_uescape_key_cold_4();
      uVar5 = extraout_RAX_00;
LAB_00132e88:
      uVar17 = uVar17 & 0xffffffff;
    }
  }
  apcStack_808[0] = (code *)0x132e99;
  test_bson_json_uescape_key_cold_6();
LAB_00132e99:
  apcStack_808[0] = (code *)0x132e9e;
  test_bson_json_uescape_key_cold_5();
LAB_00132e9e:
  apcStack_808[0] = (code *)0x132ea3;
  test_bson_json_uescape_key_cold_2();
LAB_00132ea3:
  apcStack_808[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_b88 = (code *)0x132ed6;
  pcStack_810 = pcVar10;
  apcStack_808[0] = (code *)&pcStack_408;
  cVar1 = bson_init_from_json(auStack_b80,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_a98);
  if (cVar1 == '\0') {
    if (iStack_a98 != 1) goto LAB_00132f22;
    if (iStack_a94 != 1) goto LAB_00132f27;
    pcVar10 = acStack_a90;
    pcStack_b88 = (code *)0x132f09;
    pcVar12 = strstr(pcVar10,"UESCAPE_TOOSHORT");
    if (pcVar12 != (char *)0x0) {
      pcStack_b88 = (code *)0x132f16;
      bson_destroy(auStack_b80);
      return;
    }
  }
  else {
    pcStack_b88 = (code *)0x132f22;
    test_bson_json_uescape_bad_cold_4();
LAB_00132f22:
    pcStack_b88 = (code *)0x132f27;
    test_bson_json_uescape_bad_cold_1();
LAB_00132f27:
    pcStack_b88 = (code *)0x132f2c;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_b88 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_f88 = (code *)0x132f67;
  pcStack_b90 = pcVar10;
  pcStack_b88 = (code *)apcStack_808;
  cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_e18);
  if (cVar1 == '\0') {
LAB_00133159:
    pcStack_f88 = (code *)0x133166;
    test_bson_json_int32_cold_1();
LAB_00133166:
    pcStack_f88 = (code *)0x13316e;
    test_bson_json_int32_cold_4();
LAB_0013316e:
    pcStack_f88 = (code *)0x13317b;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_f88 = (code *)0x132f86;
    cVar1 = bson_iter_init_find(auStack_f80,acStack_f00,"x");
    if (cVar1 == '\0') {
      pcStack_f88 = (code *)0x133136;
      test_bson_json_int32_cold_2();
LAB_00133136:
      pcStack_f88 = (code *)0x13313b;
      test_bson_json_int32_cold_3();
LAB_0013313b:
      pcStack_f88 = (code *)0x133140;
      test_bson_json_int32_cold_6();
LAB_00133140:
      pcStack_f88 = (code *)0x133145;
      test_bson_json_int32_cold_7();
      pcStack_f88 = (code *)0x13314a;
      test_bson_json_int32_cold_10();
      pcStack_f88 = (code *)0x13314f;
      test_bson_json_int32_cold_11();
      pcStack_f88 = (code *)0x133154;
      test_bson_json_int32_cold_14();
      pcStack_f88 = (code *)0x133159;
      test_bson_json_int32_cold_15();
      goto LAB_00133159;
    }
    pcStack_f88 = (code *)0x132f96;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x10) goto LAB_00133136;
    pcStack_f88 = (code *)0x132fa7;
    iVar2 = bson_iter_int32(auStack_f80);
    if (iVar2 != 0x7fffffff) goto LAB_00133166;
    pcVar10 = acStack_f00;
    pcStack_f88 = (code *)0x132fc2;
    bson_destroy(pcVar10);
    pcStack_f88 = (code *)0x132fe0;
    cVar1 = bson_init_from_json(pcVar10,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_e18);
    if (cVar1 == '\0') goto LAB_0013316e;
    pcStack_f88 = (code *)0x132fff;
    cVar1 = bson_iter_init_find(auStack_f80,acStack_f00,"x");
    if (cVar1 == '\0') goto LAB_0013313b;
    pcStack_f88 = (code *)0x13300f;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x10) goto LAB_00133140;
    pcStack_f88 = (code *)0x133020;
    bson_iter_int32(auStack_f80);
  }
  pcStack_f88 = (code *)0x133183;
  test_bson_json_int32_cold_8();
  pcStack_f88 = (code *)0x133190;
  test_bson_json_int32_cold_9();
  pcStack_f88 = (code *)0x133198;
  test_bson_json_int32_cold_12();
  pcStack_f88 = (code *)0x1331a5;
  test_bson_json_int32_cold_13();
  pcStack_f88 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_1388 = (code *)0x1331e2;
  pcStack_f98 = pcVar10;
  pvStack_f90 = __buf;
  pcStack_f88 = (code *)&pcStack_b88;
  cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_1220);
  if (cVar1 == '\0') {
LAB_0013347b:
    pcStack_1388 = (code *)0x133488;
    test_bson_json_int64_cold_1();
LAB_00133488:
    pcStack_1388 = (code *)0x133490;
    test_bson_json_int64_cold_4();
LAB_00133490:
    pcStack_1388 = (code *)0x13349d;
    test_bson_json_int64_cold_5();
LAB_0013349d:
    pcStack_1388 = (code *)0x1334a5;
    test_bson_json_int64_cold_8();
LAB_001334a5:
    pcStack_1388 = (code *)0x1334aa;
    test_bson_json_int64_cold_9();
LAB_001334aa:
    pcStack_1388 = (code *)0x1334af;
    test_bson_json_int64_cold_10();
LAB_001334af:
    pcStack_1388 = (code *)0x1334b7;
    test_bson_json_int64_cold_23();
LAB_001334b7:
    pcStack_1388 = (code *)0x1334bc;
    test_bson_json_int64_cold_11();
LAB_001334bc:
    pcStack_1388 = (code *)0x1334c1;
    test_bson_json_int64_cold_12();
LAB_001334c1:
    pcStack_1388 = (code *)0x1334c9;
    test_bson_json_int64_cold_21();
LAB_001334c9:
    pcStack_1388 = (code *)0x1334ce;
    test_bson_json_int64_cold_13();
LAB_001334ce:
    pcStack_1388 = (code *)0x1334d3;
    test_bson_json_int64_cold_14();
LAB_001334d3:
    pcStack_1388 = (code *)0x1334db;
    test_bson_json_int64_cold_19();
LAB_001334db:
    pcStack_1388 = (code *)0x1334e0;
    test_bson_json_int64_cold_15();
LAB_001334e0:
    pcStack_1388 = (code *)0x1334e5;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_1388 = (code *)0x133201;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') {
      pcStack_1388 = (code *)0x133458;
      test_bson_json_int64_cold_2();
LAB_00133458:
      pcStack_1388 = (code *)0x13345d;
      test_bson_json_int64_cold_3();
LAB_0013345d:
      pcStack_1388 = (code *)0x133462;
      test_bson_json_int64_cold_6();
LAB_00133462:
      pcStack_1388 = (code *)0x133467;
      test_bson_json_int64_cold_7();
LAB_00133467:
      pcStack_1388 = (code *)0x13346c;
      test_bson_json_int64_cold_24();
LAB_0013346c:
      pcStack_1388 = (code *)0x133471;
      test_bson_json_int64_cold_22();
LAB_00133471:
      pcStack_1388 = (code *)0x133476;
      test_bson_json_int64_cold_20();
LAB_00133476:
      pcStack_1388 = (code *)0x13347b;
      test_bson_json_int64_cold_18();
      goto LAB_0013347b;
    }
    pcStack_1388 = (code *)0x133211;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x12) goto LAB_00133458;
    __buf = (void *)0x7fffffffffffffff;
    pcStack_1388 = (code *)0x13322c;
    lVar16 = bson_iter_int64(auStack_1380);
    if (lVar16 != 0x7fffffffffffffff) goto LAB_00133488;
    pcVar10 = acStack_1300;
    pcStack_1388 = (code *)0x133245;
    bson_destroy(pcVar10);
    pcStack_1388 = (code *)0x133263;
    cVar1 = bson_init_from_json(pcVar10,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 == '\0') goto LAB_00133490;
    pcStack_1388 = (code *)0x133282;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_0013345d;
    pcStack_1388 = (code *)0x133292;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x12) goto LAB_00133462;
    pcStack_1388 = (code *)0x1332a3;
    lVar16 = bson_iter_int64(auStack_1380);
    __buf = (void *)0x8000000000000000;
    if (lVar16 != -0x8000000000000000) goto LAB_0013349d;
    pcVar10 = acStack_1300;
    pcStack_1388 = (code *)0x1332bf;
    bson_destroy(pcVar10);
    pcStack_1388 = (code *)0x1332dd;
    cVar1 = bson_init_from_json(pcVar10,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 != '\0') goto LAB_00133467;
    if (iStack_1220 != 1) goto LAB_001334a5;
    if (iStack_121c != 2) goto LAB_001334aa;
    pcVar10 = acStack_1218;
    pcStack_1388 = (code *)0x13331c;
    pcVar12 = strstr(pcVar10,"Number \"9223372036854775808\" is out of range");
    if (pcVar12 == (char *)0x0) goto LAB_001334af;
    pcStack_1388 = (code *)0x133348;
    cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 != '\0') goto LAB_0013346c;
    if (iStack_1220 != 1) goto LAB_001334b7;
    if (iStack_121c != 2) goto LAB_001334bc;
    pcStack_1388 = (code *)0x13337f;
    pcVar12 = strstr(pcVar10,"Number \"-9223372036854775809\" is out of range");
    if (pcVar12 == (char *)0x0) goto LAB_001334c1;
    pcStack_1388 = (code *)0x1333ab;
    cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 != '\0') goto LAB_00133471;
    if (iStack_1220 != 1) goto LAB_001334c9;
    if (iStack_121c != 2) goto LAB_001334ce;
    pcStack_1388 = (code *)0x1333e2;
    pcVar12 = strstr(pcVar10,"Number \"10000000000000000000\" is out of range");
    if (pcVar12 == (char *)0x0) goto LAB_001334d3;
    pcStack_1388 = (code *)0x13340e;
    cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_1220);
    if (cVar1 != '\0') goto LAB_00133476;
    if (iStack_1220 != 1) goto LAB_001334db;
    if (iStack_121c != 2) goto LAB_001334e0;
    pcStack_1388 = (code *)0x133441;
    pcVar12 = strstr(pcVar10,"Number \"-10000000000000000000\" is out of range");
    if (pcVar12 != (char *)0x0) {
      return;
    }
  }
  pcStack_1388 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_1788 = (code *)0x133520;
  pcStack_1390 = pcVar10;
  pcStack_1388 = (code *)&pcStack_f88;
  cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": 1 }",0xffffffffffffffff,auStack_1618);
  if (cVar1 == '\0') {
LAB_001337c5:
    pcStack_1788 = (code *)0x1337d2;
    test_bson_json_double_cold_1();
LAB_001337d2:
    pcStack_1788 = (code *)0x1337da;
    test_bson_json_double_cold_4();
LAB_001337da:
    pcStack_1788 = (code *)0x1337e7;
    test_bson_json_double_cold_5();
LAB_001337e7:
    pcStack_1788 = (code *)0x1337ef;
    test_bson_json_double_cold_8();
LAB_001337ef:
    pcStack_1788 = (code *)0x1337fc;
    test_bson_json_double_cold_9();
LAB_001337fc:
    pcStack_1788 = (code *)0x133804;
    test_bson_json_double_cold_12();
LAB_00133804:
    pcStack_1788 = (code *)0x133811;
    test_bson_json_double_cold_13();
LAB_00133811:
    pcStack_1788 = (code *)0x133819;
    test_bson_json_double_cold_16();
LAB_00133819:
    pcStack_1788 = (code *)0x133826;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_1788 = (code *)0x13353f;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') {
      pcStack_1788 = (code *)0x133793;
      test_bson_json_double_cold_2();
LAB_00133793:
      pcStack_1788 = (code *)0x133798;
      test_bson_json_double_cold_3();
LAB_00133798:
      pcStack_1788 = (code *)0x13379d;
      test_bson_json_double_cold_6();
LAB_0013379d:
      pcStack_1788 = (code *)0x1337a2;
      test_bson_json_double_cold_7();
LAB_001337a2:
      pcStack_1788 = (code *)0x1337a7;
      test_bson_json_double_cold_10();
LAB_001337a7:
      pcStack_1788 = (code *)0x1337ac;
      test_bson_json_double_cold_11();
LAB_001337ac:
      pcStack_1788 = (code *)0x1337b1;
      test_bson_json_double_cold_14();
LAB_001337b1:
      pcStack_1788 = (code *)0x1337b6;
      test_bson_json_double_cold_15();
LAB_001337b6:
      pcStack_1788 = (code *)0x1337bb;
      test_bson_json_double_cold_18();
LAB_001337bb:
      pcStack_1788 = (code *)0x1337c0;
      test_bson_json_double_cold_19();
LAB_001337c0:
      pcStack_1788 = (code *)0x1337c5;
      test_bson_json_double_cold_21();
      goto LAB_001337c5;
    }
    pcStack_1788 = (code *)0x13354f;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 0x10) goto LAB_00133793;
    pcStack_1788 = (code *)0x133560;
    iVar2 = bson_iter_int32(auStack_1780);
    if (iVar2 != 1) goto LAB_001337d2;
    pcVar10 = acStack_1700;
    pcStack_1788 = (code *)0x133579;
    bson_destroy(pcVar10);
    pcStack_1788 = (code *)0x133597;
    cVar1 = bson_init_from_json(pcVar10,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_1618);
    if (cVar1 == '\0') goto LAB_001337da;
    pcStack_1788 = (code *)0x1335b6;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_00133798;
    pcStack_1788 = (code *)0x1335c6;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 0x12) goto LAB_0013379d;
    pcStack_1788 = (code *)0x1335d7;
    lVar16 = bson_iter_int64(auStack_1780);
    if (lVar16 != 0x100000000) goto LAB_001337e7;
    pcVar10 = acStack_1700;
    pcStack_1788 = (code *)0x1335fa;
    bson_destroy(pcVar10);
    pcStack_1788 = (code *)0x133618;
    cVar1 = bson_init_from_json(pcVar10,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_1618);
    if (cVar1 == '\0') goto LAB_001337ef;
    pcStack_1788 = (code *)0x133637;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_001337a2;
    pcStack_1788 = (code *)0x133647;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 1) goto LAB_001337a7;
    pcStack_1788 = (code *)0x133658;
    dVar26 = (double)bson_iter_double(auStack_1780);
    if ((dVar26 != 1.0) || (NAN(dVar26))) goto LAB_001337fc;
    pcVar10 = acStack_1700;
    pcStack_1788 = (code *)0x13367c;
    bson_destroy(pcVar10);
    pcStack_1788 = (code *)0x13369a;
    cVar1 = bson_init_from_json(pcVar10,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_1618);
    if (cVar1 == '\0') goto LAB_00133804;
    pcStack_1788 = (code *)0x1336b9;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_001337ac;
    pcStack_1788 = (code *)0x1336c9;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 1) goto LAB_001337b1;
    pcStack_1788 = (code *)0x1336da;
    dVar26 = (double)bson_iter_double(auStack_1780);
    if ((dVar26 != 0.0) || (NAN(dVar26))) goto LAB_00133811;
    pcVar10 = acStack_1700;
    pcStack_1788 = (code *)0x1336fe;
    bson_destroy(pcVar10);
    pcStack_1788 = (code *)0x13371c;
    cVar1 = bson_init_from_json(pcVar10,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_1618);
    if (cVar1 == '\0') goto LAB_00133819;
    pcStack_1788 = (code *)0x13373b;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_001337b6;
    pcStack_1788 = (code *)0x133747;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 1) goto LAB_001337bb;
    pcStack_1788 = (code *)0x133754;
    dVar26 = (double)bson_iter_double(auStack_1780);
    if ((dVar26 == 0.0) && (!NAN(dVar26))) {
      pcStack_1788 = (code *)0x133770;
      bson_iter_double(auStack_1780);
      if (extraout_XMM0_Db < 0) {
        pcStack_1788 = (code *)0x133787;
        bson_destroy(acStack_1700);
        return;
      }
      goto LAB_001337c0;
    }
  }
  pcStack_1788 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar12 = "2e400";
  ppuVar24 = &PTR_anon_var_dwarf_1aedf_00163308;
  pcStack_17b0 = pcVar10;
  puStack_17a8 = __n;
  puStack_17a0 = puVar7;
  pvStack_1798 = __buf;
  pvStack_1790 = pvVar6;
  pcStack_1788 = (code *)&pcStack_1388;
  while( true ) {
    pcStack_1b08 = (code *)0x13386c;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar12);
    pcStack_1b08 = (code *)0x133889;
    cVar1 = bson_init_from_json(auStack_1900,uVar5,0xffffffffffffffff,&iStack_1b00);
    if (cVar1 != '\0') break;
    if (iStack_1b00 != 1) goto LAB_00133953;
    if (iStack_1afc != 2) goto LAB_0013394e;
    pcStack_1b08 = (code *)0x1338b7;
    pcVar10 = strstr(acStack_1af8,"out of range");
    if (pcVar10 == (char *)0x0) goto LAB_00133958;
    pcStack_1b08 = (code *)0x1338c8;
    bson_free(uVar5);
    pcStack_1b08 = (code *)0x1338d9;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar12);
    pcStack_1b08 = (code *)0x1338f6;
    cVar1 = bson_init_from_json(auStack_1900,uVar5,0xffffffffffffffff,&iStack_1b00);
    if (cVar1 != '\0') goto LAB_00133949;
    if (iStack_1b00 != 1) goto LAB_00133967;
    if (iStack_1afc != 2) goto LAB_00133962;
    pcStack_1b08 = (code *)0x133918;
    pcVar10 = strstr(acStack_1af8,"out of range");
    if (pcVar10 == (char *)0x0) goto LAB_0013396c;
    pcStack_1b08 = (code *)0x133925;
    bson_free(uVar5);
    pcVar12 = *ppuVar24;
    ppuVar24 = ppuVar24 + 1;
    if (pcVar12 == (char *)0x0) {
      return;
    }
  }
  pcStack_1b08 = (code *)0x133949;
  test_bson_json_double_overflow_cold_8();
LAB_00133949:
  pcStack_1b08 = (code *)0x13394e;
  test_bson_json_double_overflow_cold_6();
LAB_0013394e:
  pcStack_1b08 = (code *)0x133953;
  test_bson_json_double_overflow_cold_2();
LAB_00133953:
  pcStack_1b08 = (code *)0x133958;
  test_bson_json_double_overflow_cold_1();
LAB_00133958:
  pcStack_1b08 = (code *)0x133962;
  test_bson_json_double_overflow_cold_7();
LAB_00133962:
  pcStack_1b08 = (code *)0x133967;
  test_bson_json_double_overflow_cold_4();
LAB_00133967:
  pcStack_1b08 = (code *)0x13396c;
  test_bson_json_double_overflow_cold_3();
LAB_0013396c:
  pcStack_1b08 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_1b20 = "out of range";
  pcVar18 = "{ \"d\": NaN }";
  ppuVar21 = &PTR_anon_var_dwarf_1af33_00163328;
  __haystack = aiStack_1e80;
  piVar23 = &iStack_1db8;
  piVar25 = (int *)0x14c766;
  pcVar10 = (char *)&dStack_1e88;
  uStack_1b30 = uVar5;
  puStack_1b28 = (undefined1 *)&iStack_1b00;
  pcStack_1b18 = pcVar12;
  ppuStack_1b10 = ppuVar24;
  pcStack_1b08 = (code *)&pcStack_1788;
  do {
    apcStack_1f08[0] = (code *)0x1339ca;
    cVar1 = bson_init_from_json(__haystack,pcVar18,0xffffffffffffffff,piVar23);
    if (cVar1 == '\0') {
      apcStack_1f08[0] = (code *)0x133b2b;
      test_bson_json_nan_cold_1();
LAB_00133b2b:
      apcStack_1f08[0] = (code *)0x133b30;
      test_bson_json_nan_cold_2();
LAB_00133b30:
      apcStack_1f08[0] = (code *)0x133b35;
      test_bson_json_nan_cold_3();
      goto LAB_00133b35;
    }
    apcStack_1f08[0] = (code *)0x1339d7;
    uVar5 = bson_bcone_magic();
    apcStack_1f08[0] = (code *)0x1339f2;
    cVar1 = bcon_extract(__haystack,"d",uVar5,1,pcVar10,0);
    if (cVar1 == '\0') goto LAB_00133b2b;
    if (!NAN(dStack_1e88) && !NAN(dStack_1e88)) goto LAB_00133b30;
    apcStack_1f08[0] = (code *)0x133a12;
    bson_destroy(__haystack);
    pcVar18 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
  } while (pcVar18 != (char *)0x0);
  pcVar12 = "{ \"d\": NaNn }";
  ppuVar21 = &PTR_anon_var_dwarf_1af63_00163358;
  __haystack = aiStack_1db0;
  piVar23 = aiStack_1e80;
  piVar25 = &iStack_1db8;
  pcVar10 = "Got parse error at";
  do {
    apcStack_1f08[0] = (code *)0x133a5e;
    cVar1 = bson_init_from_json(piVar23,pcVar12,0xffffffffffffffff,piVar25);
    if (cVar1 != '\0') goto LAB_00133b35;
    if (iStack_1db8 != 1) goto LAB_00133b4c;
    if (iStack_1db4 != 1) goto LAB_00133b3f;
    apcStack_1f08[0] = (code *)0x133a91;
    pcVar12 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar12 == (char *)0x0) goto LAB_00133b44;
    pcVar12 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
  } while (pcVar12 != (char *)0x0);
  pcVar12 = "{ \"d\": nu";
  ppuVar21 = &PTR_anon_var_dwarf_1afab_00163398;
  piVar23 = aiStack_1e80;
  piVar25 = &iStack_1db8;
  pcVar10 = "Incomplete JSON";
  while( true ) {
    apcStack_1f08[0] = (code *)0x133ade;
    cVar1 = bson_init_from_json(piVar23,pcVar12,0xffffffffffffffff,piVar25);
    if (cVar1 != '\0') break;
    if (iStack_1db8 != 1) goto LAB_00133b5e;
    if (iStack_1db4 != 1) goto LAB_00133b51;
    apcStack_1f08[0] = (code *)0x133b05;
    pcVar12 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar12 == (char *)0x0) goto LAB_00133b56;
    pcVar12 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
    if (pcVar12 == (char *)0x0) {
      return;
    }
  }
LAB_00133b3a:
  apcStack_1f08[0] = (code *)0x133b3f;
  test_bson_json_nan_cold_9();
LAB_00133b3f:
  apcStack_1f08[0] = (code *)0x133b44;
  test_bson_json_nan_cold_5();
LAB_00133b44:
  apcStack_1f08[0] = (code *)0x133b4c;
  test_bson_json_nan_cold_10();
LAB_00133b4c:
  apcStack_1f08[0] = (code *)0x133b51;
  test_bson_json_nan_cold_4();
LAB_00133b51:
  apcStack_1f08[0] = (code *)0x133b56;
  test_bson_json_nan_cold_7();
LAB_00133b56:
  apcStack_1f08[0] = (code *)0x133b5e;
  test_bson_json_nan_cold_8();
LAB_00133b5e:
  apcStack_1f08[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar12 = "{ \"d\": Infinity }";
  ppuVar24 = &PTR_anon_var_dwarf_1b023_001633b8;
  piStack_1f30 = __haystack;
  pdStack_1f28 = (double *)pcVar10;
  ppuStack_1f20 = ppuVar21;
  piStack_1f18 = piVar23;
  piStack_1f10 = piVar25;
  apcStack_1f08[0] = (code *)&pcStack_1b08;
  do {
    apcStack_2308[0] = (code *)0x133bb4;
    cVar1 = bson_init_from_json(auStack_2280,pcVar12,0xffffffffffffffff,&uStack_21b8);
    if (cVar1 == '\0') {
      apcStack_2308[0] = (code *)0x133dd5;
      test_bson_json_infinity_cold_1();
LAB_00133dd5:
      apcStack_2308[0] = (code *)0x133dda;
      test_bson_json_infinity_cold_2();
LAB_00133dda:
      apcStack_2308[0] = (code *)0x133ddf;
      test_bson_json_infinity_cold_3();
      goto LAB_00133ddf;
    }
    apcStack_2308[0] = (code *)0x133bc1;
    __haystack = (int *)bson_bcone_magic();
    apcStack_2308[0] = (code *)0x133bdf;
    cVar1 = bcon_extract(auStack_2280,"d",__haystack,1,&puStack_2288,0);
    if (cVar1 == '\0') goto LAB_00133dd5;
    if ((NAN((double)puStack_2288)) ||
       (!NAN((double)puStack_2288 - (double)puStack_2288) &&
        !NAN((double)puStack_2288 - (double)puStack_2288))) goto LAB_00133dda;
    apcStack_2308[0] = (code *)0x133c0d;
    bson_destroy(auStack_2280);
    pcVar12 = *ppuVar24;
    ppuVar24 = ppuVar24 + 1;
  } while (pcVar12 != (char *)0x0);
  pcVar10 = "{ \"d\": -Infinity }";
  ppuVar24 = &PTR_anon_var_dwarf_1b047_001633d8;
  do {
    apcStack_2308[0] = (code *)0x133c52;
    cVar1 = bson_init_from_json(auStack_2280,pcVar10,0xffffffffffffffff,&uStack_21b8);
    if (cVar1 == '\0') goto LAB_00133ddf;
    apcStack_2308[0] = (code *)0x133c75;
    cVar1 = bcon_extract(auStack_2280,"d",__haystack,1,&puStack_2288,0);
    if (cVar1 == '\0') goto LAB_00133de4;
    if ((NAN((double)puStack_2288)) || (!NAN((double)puStack_2288 - (double)puStack_2288)))
    goto LAB_00133de9;
    if (0.0 <= (double)puStack_2288) goto LAB_00133dee;
    apcStack_2308[0] = (code *)0x133cb5;
    bson_destroy(auStack_2280);
    pcVar10 = *ppuVar24;
    ppuVar24 = ppuVar24 + 1;
  } while (pcVar10 != (char *)0x0);
  pcVar12 = "{ \"d\": Infinityy }";
  ppuVar21 = &PTR_anon_var_dwarf_1b06b_001633f8;
  __haystack = aiStack_21b0;
  ppuVar24 = (undefined **)&uStack_21b8;
  pcVar10 = "Got parse error at";
  do {
    apcStack_2308[0] = (code *)0x133d04;
    cVar1 = bson_init_from_json(auStack_2280,pcVar12,0xffffffffffffffff,ppuVar24);
    if (cVar1 != '\0') goto LAB_00133df3;
    if ((int)uStack_21b8 != 1) goto LAB_00133e0a;
    if (uStack_21b8._4_4_ != 1) goto LAB_00133dfd;
    apcStack_2308[0] = (code *)0x133d37;
    pcVar12 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar12 == (char *)0x0) goto LAB_00133e02;
    pcVar12 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
  } while (pcVar12 != (char *)0x0);
  pcVar12 = "{ \"d\": In";
  ppuVar21 = &PTR_anon_var_dwarf_1b0cb_00163448;
  ppuVar24 = (undefined **)&uStack_21b8;
  pcVar10 = "Incomplete JSON";
  while( true ) {
    apcStack_2308[0] = (code *)0x133d84;
    cVar1 = bson_init_from_json(auStack_2280,pcVar12,0xffffffffffffffff,ppuVar24);
    if (cVar1 != '\0') break;
    if ((int)uStack_21b8 != 1) goto LAB_00133e1c;
    if (uStack_21b8._4_4_ != 1) goto LAB_00133e0f;
    apcStack_2308[0] = (code *)0x133daf;
    pcVar12 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar12 == (char *)0x0) goto LAB_00133e14;
    pcVar12 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
    if (pcVar12 == (char *)0x0) {
      return;
    }
  }
LAB_00133df8:
  apcStack_2308[0] = (code *)0x133dfd;
  test_bson_json_infinity_cold_13();
LAB_00133dfd:
  apcStack_2308[0] = (code *)0x133e02;
  test_bson_json_infinity_cold_9();
LAB_00133e02:
  apcStack_2308[0] = (code *)0x133e0a;
  test_bson_json_infinity_cold_14();
LAB_00133e0a:
  apcStack_2308[0] = (code *)0x133e0f;
  test_bson_json_infinity_cold_8();
LAB_00133e0f:
  apcStack_2308[0] = (code *)0x133e14;
  test_bson_json_infinity_cold_11();
LAB_00133e14:
  apcStack_2308[0] = (code *)0x133e1c;
  test_bson_json_infinity_cold_12();
LAB_00133e1c:
  puVar7 = auStack_2280;
  apcStack_2308[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_2688 = (code *)0x133e4e;
  apcStack_2308[0] = (code *)apcStack_1f08;
  cVar1 = bson_init_from_json(auStack_2680,"{ \"x\": null }",0xffffffffffffffff,auStack_2590);
  if (cVar1 == '\0') {
    pcStack_2688 = (code *)0x133e89;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_2688 = (code *)0x133e57;
    uVar5 = bson_bcone_magic();
    pcStack_2688 = (code *)0x133e73;
    cVar1 = bcon_extract(auStack_2680,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_2688 = (code *)0x133e7f;
      bson_destroy(auStack_2680);
      return;
    }
  }
  pcStack_2688 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_2a88 = (code *)0x0;
  pcStack_2a90 = "}";
  acStack_2aa0[8] = -0x2e;
  acStack_2aa0[9] = '>';
  acStack_2aa0[10] = '\x13';
  acStack_2aa0[0xb] = '\0';
  acStack_2aa0[0xc] = '\0';
  acStack_2aa0[0xd] = '\0';
  acStack_2aa0[0xe] = '\0';
  acStack_2aa0[0xf] = '\0';
  piStack_26b0 = __haystack;
  pcStack_26a8 = pcVar10;
  ppuStack_26a0 = ppuVar21;
  puStack_2698 = puVar7;
  ppuStack_2690 = ppuVar24;
  pcStack_2688 = (code *)apcStack_2308;
  uVar17 = bcon_new(0,"a","{","b","{");
  uStack_2990 = 0;
  uStack_2988 = 0;
  uStack_29a0 = 0;
  uStack_2998 = 0;
  uStack_29b0 = 0;
  uStack_29a8 = 0;
  uStack_29c0 = 0;
  uStack_29b8 = 0;
  uStack_29d0 = 0;
  uStack_29c8 = 0;
  uStack_29e0 = 0;
  uStack_29d8 = 0;
  uStack_29f0 = 0;
  uStack_29e8 = 0;
  uStack_2a00 = (undefined *)0x500000003;
  uStack_29f8 = 5;
  pcStack_2a88 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&uStack_2a00,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_2938);
  if (cVar1 != '\0') {
    pcStack_2a88 = (code *)0x133f47;
    ppuVar24 = (undefined **)bson_get_data(&uStack_2a00);
    pcStack_2a88 = (code *)0x133f52;
    puVar7 = (undefined1 *)bson_get_data(uVar17);
    if (*(int *)(uVar17 + 4) == uStack_2a00._4_4_) {
      pcStack_2a88 = (code *)0x133f67;
      pvVar6 = (void *)bson_get_data(uVar17);
      pcStack_2a88 = (code *)0x133f77;
      pvVar22 = (void *)bson_get_data(&uStack_2a00);
      pcStack_2a88 = (code *)0x133f85;
      iVar2 = bcmp(pvVar6,pvVar22,(ulong)*(uint *)(uVar17 + 4));
      if (iVar2 == 0) {
        pcStack_2a88 = (code *)0x133f96;
        bson_destroy(&uStack_2a00);
        pcStack_2a88 = (code *)0x133f9e;
        bson_destroy(uVar17);
        return;
      }
    }
    ppuVar21 = (undefined **)&uStack_2a00;
    pcStack_2a88 = (code *)0x133fbf;
    pcVar10 = (char *)bson_as_canonical_extended_json(ppuVar21);
    pcStack_2a88 = (code *)0x133fcc;
    uVar5 = bson_as_canonical_extended_json(uVar17);
    uVar3 = *(uint *)(uVar17 + 4);
    if (uStack_2a00._4_4_ != 0) {
      uVar19 = 0;
      do {
        if (uVar3 == (uint)uVar19) break;
        if (*(char *)((long)ppuVar24 + uVar19) != puVar7[uVar19]) goto LAB_0013409c;
        uVar19 = uVar19 + 1;
      } while (uStack_2a00._4_4_ != (uint)uVar19);
    }
    uVar4 = uStack_2a00._4_4_;
    if (uStack_2a00._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar19 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_2a88 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,pcVar10,uVar5);
      pcStack_2a88 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      pcVar10 = (char *)(ulong)uVar3;
      pcStack_2a88 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_2a04 = uVar3;
      if (uVar3 == 0xffffffff) break;
      ppuVar21 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      pcVar10 = (char *)((ulong)uStack_2a00 >> 0x20);
      pcStack_2a88 = (code *)0x134075;
      pcVar12 = (char *)write(uVar3,ppuVar24,(size_t)pcVar10);
      if (pcVar12 != pcVar10) goto LAB_001340ad;
      uVar17 = (ulong)*(uint *)(uVar17 + 4);
      pcStack_2a88 = (code *)0x13408b;
      uVar19 = write(uVar4,puVar7,uVar17);
      if (uVar19 != uVar17) goto LAB_001340b2;
      uVar19 = (ulong)uVar4;
      pcStack_2a88 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar5 = extraout_RAX_01;
LAB_0013409c:
      uVar19 = uVar19 & 0xffffffff;
    }
    pcStack_2a88 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_2a88 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_2a88 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_2a88 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_2a88 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar12 = acStack_2aa0;
  acStack_2aa0[8] = '\0';
  acStack_2aa0[9] = '\0';
  acStack_2aa0[10] = '\0';
  acStack_2aa0[0xb] = '\0';
  acStack_2aa0[0xc] = '\0';
  acStack_2aa0[0xd] = '\0';
  acStack_2aa0[0xe] = '@';
  acStack_2aa0[0xf] = '0';
  acStack_2aa0[0] = '\v';
  acStack_2aa0[1] = '\0';
  acStack_2aa0[2] = '\0';
  acStack_2aa0[3] = '\0';
  acStack_2aa0[4] = '\0';
  acStack_2aa0[5] = '\0';
  acStack_2aa0[6] = '\0';
  acStack_2aa0[7] = '\0';
  pcStack_2ab0 = (code *)0x1340ea;
  pcStack_2a90 = (char *)uVar17;
  pcStack_2a88 = (code *)puVar7;
  plVar13 = (long *)bson_new();
  pcStack_2ab0 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar13,"decimal128",0xffffffff,pcVar12);
  if (cVar1 == '\0') {
    pcStack_2ab0 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_2ab0 = (code *)0x134113;
    pcVar12 = (char *)bson_as_json(plVar13,auStack_2aa8);
    if (pcVar12 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_2ab0 = (code *)0x13413d;
      bson_free(pcVar12);
      pcStack_2ab0 = (code *)0x134145;
      bson_destroy(plVar13);
      return;
    }
    pcStack_2ab0 = (code *)0x134131;
    iVar2 = strcmp(pcVar12,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_2ab0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar27 = &pcStack_2ab0;
  ppuStack_2f08 = (undefined **)0x13418d;
  plStack_2ab8 = plVar13;
  pcStack_2ab0 = (code *)&pcStack_2688;
  cVar1 = bson_init_from_json(auStack_2e00,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_2d18);
  if (cVar1 == '\0') goto LAB_00134231;
  ppuStack_2f08 = (undefined **)0x1341aa;
  cVar1 = bson_iter_init(auStack_2e80,auStack_2e00);
  if (cVar1 == '\0') {
    ppuStack_2f08 = (undefined **)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    ppuStack_2f08 = (undefined **)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    ppuStack_2f08 = (undefined **)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    ppuStack_2f08 = (undefined **)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    ppuStack_2f08 = (undefined **)0x1341c2;
    cVar1 = bson_iter_find(auStack_2e80,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    ppuStack_2f08 = (undefined **)0x1341d3;
    iVar2 = bson_iter_type(auStack_2e80);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar13 = &lStack_2e90;
    ppuStack_2f08 = (undefined **)0x1341ed;
    bson_iter_decimal128(auStack_2e80,plVar13);
    if (lStack_2e90 != 0xb) goto LAB_00134227;
    if (lStack_2e88 == 0x3040000000000000) {
      ppuStack_2f08 = (undefined **)0x134211;
      bson_destroy(auStack_2e00);
      return;
    }
  }
  ppuStack_2f08 = (undefined **)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  ppuStack_2f08 = (undefined **)test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar18 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar20 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_2f20 = plVar13;
  pcStack_2f18 = pcVar10;
  pcStack_2f10 = pcVar12;
  ppuStack_2f08 = ppuVar24;
  do {
    pcStack_3130 = (code *)0x134273;
    lVar16 = bson_new_from_json(pcVar18,0xffffffffffffffff,&iStack_3120);
    if (lVar16 != 0) {
      pcStack_3130 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_3130 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_3118,
              ppuVar24);
      pcStack_3130 = (code *)0x1342e3;
      abort();
    }
    if (iStack_3120 != 1) {
LAB_001342e8:
      pcStack_3130 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_3348 = (code *)0x13430d;
      pcStack_3138 = acStack_3118;
      pcStack_3130 = (code *)&iStack_3120;
      pcVar10 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_3338);
      pcStack_3348 = (code *)0x13431a;
      pcVar12 = (char *)bson_as_json(pcVar10,0);
      if (pcVar12 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_3348 = (code *)0x134344;
        bson_free(pcVar12);
        pcStack_3348 = (code *)0x13434c;
        bson_destroy(pcVar10);
        return;
      }
      pcStack_3348 = (code *)0x134338;
      iVar2 = strcmp(pcVar12,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_3348 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_3558 = 0x2200223a2261227b;
      uStack_3550 = 0x7d;
      uStack_355c = 0x227b;
      pcStack_3348 = (code *)pcVar10;
      lVar16 = bson_new_from_json(&uStack_3558,9,&iStack_3548);
      if (lVar16 == 0) {
        if (iStack_3548 != 1) goto LAB_00134418;
        if (iStack_3544 != 1) goto LAB_0013441d;
        pcVar10 = acStack_3540;
        pcVar18 = strstr(pcVar10,"Got parse error");
        if (pcVar18 == (char *)0x0) goto LAB_00134422;
        lVar16 = bson_new_from_json(&uStack_355c,3,&iStack_3548);
        if (lVar16 != 0) goto LAB_00134413;
        if (iStack_3548 != 1) goto LAB_0013442a;
        if (iStack_3544 == 1) {
          pcVar18 = strstr(pcVar10,"Got parse error");
          if (pcVar18 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX_02;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar8 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0,uVar5,pcVar10,ppuVar20,ppuVar21,pcVar12,ppuVar24,ppcVar27
                      );
      uVar14 = bcon_new(0,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar14,0);
      uVar5 = bson_new();
      uVar14 = bson_new();
      uVar15 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar14,uVar15,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar8,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_311c != 2) {
      pcStack_3130 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    ppuVar24 = (undefined **)ppuVar20[-1];
    pcStack_3130 = (code *)0x13429a;
    pcVar10 = strstr(acStack_3118,(char *)ppuVar24);
    if (pcVar10 == (char *)0x0) goto LAB_001342c0;
    pcVar18 = *ppuVar20;
    ppuVar20 = ppuVar20 + 2;
    if (pcVar18 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00133b35:
  apcStack_1f08[0] = (code *)0x133b3a;
  test_bson_json_nan_cold_11();
  goto LAB_00133b3a;
LAB_00133ddf:
  apcStack_2308[0] = (code *)0x133de4;
  test_bson_json_infinity_cold_4();
LAB_00133de4:
  apcStack_2308[0] = (code *)0x133de9;
  test_bson_json_infinity_cold_5();
LAB_00133de9:
  apcStack_2308[0] = (code *)0x133dee;
  test_bson_json_infinity_cold_6();
LAB_00133dee:
  ppuVar21 = &puStack_2288;
  pcVar10 = "d";
  apcStack_2308[0] = (code *)0x133df3;
  test_bson_json_infinity_cold_7();
LAB_00133df3:
  apcStack_2308[0] = (code *)0x133df8;
  test_bson_json_infinity_cold_15();
  goto LAB_00133df8;
}

Assistant:

static void
test_bson_json_uescape (void)
{
   bson_error_t error;
   bson_t b;
   bool r;

   const char *euro = "{ \"euro\": \"\\u20AC\"}";
   bson_t *bson_euro = BCON_NEW ("euro", BCON_UTF8 ("\xE2\x82\xAC"));

   const char *crlf = "{ \"crlf\": \"\\r\\n\"}";
   bson_t *bson_crlf = BCON_NEW ("crlf", BCON_UTF8 ("\r\n"));

   const char *quote = "{ \"quote\": \"\\\"\"}";
   bson_t *bson_quote = BCON_NEW ("quote", BCON_UTF8 ("\""));

   const char *backslash = "{ \"backslash\": \"\\\\\"}";
   bson_t *bson_backslash = BCON_NEW ("backslash", BCON_UTF8 ("\\"));

   const char *empty = "{ \"\": \"\"}";
   bson_t *bson_empty = BCON_NEW ("", BCON_UTF8 (""));

   const char *escapes = "{ \"escapes\": \"\\f\\b\\t\"}";
   bson_t *bson_escapes = BCON_NEW ("escapes", BCON_UTF8 ("\f\b\t"));

   const char *nil_byte = "{ \"nil\": \"\\u0000\"}";
   bson_t *bson_nil_byte = bson_new (); /* we'll append "\0" to it, below */

   typedef struct {
      const char *json;
      bson_t *expected_bson;
   } uencode_test_t;

   uencode_test_t tests[] = {
      {euro, bson_euro},
      {crlf, bson_crlf},
      {quote, bson_quote},
      {backslash, bson_backslash},
      {empty, bson_empty},
      {escapes, bson_escapes},
      {nil_byte, bson_nil_byte},
   };

   int n_tests = sizeof (tests) / sizeof (uencode_test_t);
   int i;

   bson_append_utf8 (bson_nil_byte, "nil", -1, "\0", 1);

   for (i = 0; i < n_tests; i++) {
      r = bson_init_from_json (&b, tests[i].json, -1, &error);

      if (!r) {
         fprintf (stderr, "%s\n", error.message);
      }

      BSON_ASSERT (r);
      bson_eq_bson (&b, tests[i].expected_bson);
      bson_destroy (&b);
   }

   for (i = 0; i < n_tests; i++) {
      bson_destroy (tests[i].expected_bson);
   }
}